

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hpp
# Opt level: O0

void __thiscall libtorrent::aux::peer_entry::peer_entry(peer_entry *this,peer_entry *param_1)

{
  peer_entry *param_1_local;
  peer_entry *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  *(undefined8 *)(this->pid).m_number._M_elems = *(undefined8 *)(param_1->pid).m_number._M_elems;
  *(undefined8 *)((this->pid).m_number._M_elems + 2) =
       *(undefined8 *)((param_1->pid).m_number._M_elems + 2);
  (this->pid).m_number._M_elems[4] = (param_1->pid).m_number._M_elems[4];
  this->port = param_1->port;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT peer_entry
	{
		std::string hostname;
		peer_id pid;
		std::uint16_t port;

		bool operator==(const peer_entry& p) const
		{ return pid == p.pid; }

		bool operator<(const peer_entry& p) const
		{ return pid < p.pid; }
	}